

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool>
               (interval_t *ldata,interval_t *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  idx_t iVar10;
  idx_t iVar11;
  idx_t i_1;
  idx_t i;
  idx_t iVar12;
  interval_t left;
  interval_t left_00;
  interval_t right;
  interval_t right_00;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    for (iVar12 = 0; count != iVar12; iVar12 = iVar12 + 1) {
      iVar10 = iVar12;
      if (lsel->sel_vector != (sel_t *)0x0) {
        iVar10 = (idx_t)lsel->sel_vector[iVar12];
      }
      iVar11 = iVar12;
      if (rsel->sel_vector != (sel_t *)0x0) {
        iVar11 = (idx_t)rsel->sel_vector[iVar12];
      }
      uVar1 = ldata[iVar10].months;
      uVar5 = ldata[iVar10].days;
      left.days = uVar5;
      left.months = uVar1;
      uVar2 = rdata[iVar11].months;
      uVar6 = rdata[iVar11].days;
      right.days = uVar6;
      right.months = uVar2;
      left.micros = ldata[iVar10].micros;
      right.micros = rdata[iVar11].micros;
      bVar9 = BinarySingleArgumentOperatorWrapper::
              Operation<bool,duckdb::GreaterThanEquals,duckdb::interval_t,duckdb::interval_t,bool>
                        (fun,left,right,result_validity,iVar12);
      result_data[iVar12] = bVar9;
    }
  }
  else {
    for (iVar12 = 0; count != iVar12; iVar12 = iVar12 + 1) {
      iVar10 = iVar12;
      if (lsel->sel_vector != (sel_t *)0x0) {
        iVar10 = (idx_t)lsel->sel_vector[iVar12];
      }
      iVar11 = iVar12;
      if (rsel->sel_vector != (sel_t *)0x0) {
        iVar11 = (idx_t)rsel->sel_vector[iVar12];
      }
      bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,iVar10);
      if (bVar9) {
        bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&rvalidity->super_TemplatedValidityMask<unsigned_long>,iVar11);
        if (!bVar9) goto LAB_0132a072;
        uVar3 = ldata[iVar10].months;
        uVar7 = ldata[iVar10].days;
        left_00.days = uVar7;
        left_00.months = uVar3;
        uVar4 = rdata[iVar11].months;
        uVar8 = rdata[iVar11].days;
        right_00.days = uVar8;
        right_00.months = uVar4;
        left_00.micros = ldata[iVar10].micros;
        right_00.micros = rdata[iVar11].micros;
        bVar9 = BinarySingleArgumentOperatorWrapper::
                Operation<bool,duckdb::GreaterThanEquals,duckdb::interval_t,duckdb::interval_t,bool>
                          (fun,left_00,right_00,result_validity,iVar12);
        result_data[iVar12] = bVar9;
      }
      else {
LAB_0132a072:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,iVar12);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}